

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

void __thiscall
klogic::mlmvn::load_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  long lVar1;
  long lVar2;
  pointer pvVar3;
  runtime_error *this_00;
  pointer pvVar4;
  pointer pmVar5;
  pointer pcVar6;
  size_t __n;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  pointer __src;
  long lVar10;
  mvn neuron;
  size_t n_neurons;
  size_t n_weights;
  pointer local_90;
  mvn local_60;
  size_t local_40;
  size_t local_38;
  
  get_stats(this,&local_38,&local_40);
  __src = (all_weights->
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pcVar6 = (all_weights->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (((long)pcVar6 - (long)__src >> 4 != local_38) ||
     (local_90 = (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
     (long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish - (long)local_90 >> 2 != local_40)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"klogic::mlmvn::load_neurons(): size mismatch");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar4 != pvVar3) {
    uVar7 = 0;
    do {
      pmVar5 = pvVar3[uVar7].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar3[uVar7].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl.
          super__Vector_impl_data._M_finish != pmVar5) {
        pvVar3 = pvVar3 + uVar7;
        lVar8 = 0;
        lVar10 = 0;
        uVar9 = 0;
        do {
          lVar1 = *(long *)((long)&(pmVar5->weights).
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar10);
          lVar2 = *(long *)((long)&(pmVar5->weights).
                                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10);
          mvn::mvn(&local_60,local_90[uVar9],(int)((ulong)(lVar1 - lVar2) >> 4) + -1);
          __n = lVar1 - lVar2;
          if (__n != 0) {
            memmove(local_60.weights.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,__src,__n);
          }
          pmVar5 = (pvVar3->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     ((long)&(pmVar5->weights).
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl + lVar10),&local_60.weights);
          *(int *)((long)&pmVar5->k + lVar10) = local_60.k;
          if (local_60.weights.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.weights.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.weights.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.weights.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          __src = (pointer)((long)__src + __n);
          uVar9 = uVar9 + 1;
          pmVar5 = (pvVar3->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x20;
          lVar8 = lVar8 + 4;
        } while (uVar9 < (ulong)((long)(pvVar3->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar5 >>
                                5));
        pvVar3 = (this->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_90 = (pointer)((long)local_90 + lVar8);
      }
      uVar7 = uVar7 + 1;
      uVar9 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar9 && uVar9 - uVar7 != 0);
    pcVar6 = (all_weights->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (__src == pcVar6) {
    if (local_90 ==
        (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      return;
    }
    __assert_fail("it_k == k_values.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                  ,0xda,
                  "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
                 );
  }
  __assert_fail("it_w == all_weights.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc",
                0xd9,
                "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
               );
}

Assistant:

void klogic::mlmvn::load_neurons(const klogic::cvector &all_weights, const std::vector<int> &k_values)
{
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    if (all_weights.size() != n_weights || k_values.size() != n_neurons)
        throw std::runtime_error("klogic::mlmvn::load_neurons(): size mismatch");

    klogic::cvector::const_iterator  it_w = all_weights.begin();
    std::vector<int>::const_iterator it_k = k_values.begin();

    for (int layer = 0; layer < layers_count(); ++layer) {
        vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            size_t w = layer_neurons[k].weights_vector().size();
            mvn neuron(*it_k, w - 1);

            copy(it_w, it_w + w, neuron.weights_vector().begin());

            layer_neurons[k] = neuron;

            it_w += w;
            ++it_k;
        }
    }

    assert(it_w == all_weights.end());
    assert(it_k == k_values.end());
}